

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

void helicsFilterRemoveTarget(HelicsFilter filt,char *target,HelicsError *err)

{
  string_view targetToRemove;
  Filter *pFVar1;
  HelicsError *in_RDX;
  long in_RSI;
  Filter *filter;
  HelicsError *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  Interface *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  
  pFVar1 = anon_unknown.dwarf_88686::getFilter(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (pFVar1 != (Filter *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RDX,-4,"The supplied string argument is null and therefore invalid");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
      targetToRemove._M_str = (char *)pFVar1;
      targetToRemove._M_len = in_stack_ffffffffffffffd8;
      helics::Interface::removeTarget(in_stack_ffffffffffffffd0,targetToRemove);
    }
  }
  return;
}

Assistant:

void helicsFilterRemoveTarget(HelicsFilter filt, const char* target, HelicsError* err)
{
    auto* filter = getFilter(filt, err);
    if (filter == nullptr) {
        return;
    }
    CHECK_NULL_STRING(target, void());
    try {
        filter->removeTarget(target);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}